

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O2

int __thiscall ncnn::Exp::forward_inplace(Exp *this,Mat *bottom_top_blob,Option *opt)

{
  long lVar1;
  int q;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  int i;
  ulong uVar6;
  float fVar7;
  
  uVar5 = bottom_top_blob->h * bottom_top_blob->w;
  lVar1 = bottom_top_blob->elemsize * bottom_top_blob->cstep;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  pvVar4 = bottom_top_blob->data;
  uVar3 = 0;
  if (0 < bottom_top_blob->c) {
    uVar3 = (ulong)(uint)bottom_top_blob->c;
  }
  if (this->base == -1.0) {
    for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        fVar7 = expf(this->scale * *(float *)((long)pvVar4 + uVar6 * 4) + this->shift);
        *(float *)((long)pvVar4 + uVar6 * 4) = fVar7;
      }
      pvVar4 = (void *)((long)pvVar4 + lVar1);
    }
  }
  else {
    for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        fVar7 = powf(this->base,this->scale * *(float *)((long)pvVar4 + uVar6 * 4) + this->shift);
        *(float *)((long)pvVar4 + uVar6 * 4) = fVar7;
      }
      pvVar4 = (void *)((long)pvVar4 + lVar1);
    }
  }
  return 0;
}

Assistant:

int Exp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = expf(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = powf(base, (shift + ptr[i] * scale));
            }
        }
    }

    return 0;
}